

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall
llvm::DWARFVerifier::verifyNameIndexEntries(DWARFVerifier *this,NameIndex *NI,NameTableEntry *NTE)

{
  unsigned_long uVar1;
  bool bVar2;
  Tag TVar3;
  Tag TVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  raw_ostream *prVar7;
  pointer ptVar8;
  unsigned_long *puVar9;
  uint64_t uVar10;
  DWARFUnit *pDVar11;
  iterator x;
  iterator y;
  Optional<unsigned_long> OVar12;
  DWARFDie DVar13;
  iterator_range<llvm::StringRef_*> iVar14;
  anon_class_40_5_28e94b40 local_610;
  anon_class_48_6_0fa2c5c1 local_5e8;
  undefined1 local_5b8 [200];
  iterator_range<llvm::StringRef_*> local_4f0;
  uint64_t local_4e0;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>_>
  local_4d8;
  undefined1 local_440 [8];
  SmallVector<llvm::StringRef,_2U> EntryNames;
  uint64_t local_408;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_>_>
  local_400;
  uint64_t local_370;
  uint64_t local_368;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>_>
  local_360;
  uint64_t local_2d0;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
  local_2c8;
  undefined1 local_258 [8];
  DWARFDie DIE;
  uint64_t local_238;
  uint64_t DIEOffset;
  uint64_t CUOffset;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
  local_220;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_1b0;
  undefined1 local_1a8;
  uint32_t local_19c;
  undefined1 local_198 [4];
  uint32_t CUIndex;
  Expected<llvm::DWARFDebugNames::Entry> EntryOr;
  uint64_t NextEntryID;
  uint64_t EntryID;
  uint NumEntries;
  uint NumErrors;
  StringRef Str;
  uint32_t local_9c;
  uint64_t local_98;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
  local_90;
  char *local_30;
  char *CStr;
  NameTableEntry *NTE_local;
  NameIndex *NI_local;
  DWARFVerifier *this_local;
  
  CStr = (char *)NTE;
  NTE_local = (NameTableEntry *)NI;
  NI_local = (NameIndex *)this;
  uVar5 = DWARFDebugNames::NameIndex::getLocalTUCount(NI);
  uVar6 = DWARFDebugNames::NameIndex::getForeignTUCount((NameIndex *)NTE_local);
  if (uVar5 + uVar6 == 0) {
    local_30 = DWARFDebugNames::NameTableEntry::getString((NameTableEntry *)CStr);
    if (local_30 == (char *)0x0) {
      prVar7 = error(this);
      local_98 = DWARFDebugNames::NameIndex::getUnitOffset((NameIndex *)NTE_local);
      local_9c = DWARFDebugNames::NameTableEntry::getIndex((NameTableEntry *)CStr);
      formatv<unsigned_long,_unsigned_int>
                (&local_90,"Name Index @ {0:x}: Unable to get string associated with name {1}.\n",
                 &local_98,&local_9c);
      raw_ostream::operator<<(prVar7,&local_90.super_formatv_object_base);
      formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
      ::~formatv_object(&local_90);
      this_local._4_4_ = 1;
    }
    else {
      StringRef::StringRef((StringRef *)&NumEntries,local_30);
      EntryID._4_4_ = 0;
      EntryID._0_4_ = 0;
      EntryOr._184_8_ = DWARFDebugNames::NameTableEntry::getEntryOffset((NameTableEntry *)CStr);
      NextEntryID = EntryOr._184_8_;
      DWARFDebugNames::NameIndex::getEntry
                ((Expected<llvm::DWARFDebugNames::Entry> *)local_198,(NameIndex *)NTE_local,
                 (uint64_t *)&EntryOr.field_0xb8);
      while( true ) {
        bVar2 = llvm::Expected::operator_cast_to_bool((Expected *)local_198);
        if (!bVar2) break;
        ptVar8 = Expected<llvm::DWARFDebugNames::Entry>::operator->
                           ((Expected<llvm::DWARFDebugNames::Entry> *)local_198);
        OVar12 = DWARFDebugNames::Entry::getCUIndex(ptVar8);
        local_1b0 = OVar12.Storage.field_0;
        local_1a8 = OVar12.Storage.hasVal;
        puVar9 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_1b0);
        uVar1 = *puVar9;
        local_19c = (uint)uVar1;
        uVar5 = DWARFDebugNames::NameIndex::getCUCount((NameIndex *)NTE_local);
        if (uVar5 < (uint)uVar1) {
          prVar7 = error(this);
          CUOffset = DWARFDebugNames::NameIndex::getUnitOffset((NameIndex *)NTE_local);
          formatv<unsigned_long,_unsigned_long_&,_unsigned_int_&>
                    (&local_220,
                     "Name Index @ {0:x}: Entry @ {1:x} contains an invalid CU index ({2}).\n",
                     &CUOffset,&NextEntryID,&local_19c);
          raw_ostream::operator<<(prVar7,&local_220.super_formatv_object_base);
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
          ::~formatv_object(&local_220);
          EntryID._4_4_ = EntryID._4_4_ + 1;
        }
        else {
          uVar10 = DWARFDebugNames::NameIndex::getCUOffset((NameIndex *)NTE_local,local_19c);
          DIEOffset = uVar10;
          ptVar8 = Expected<llvm::DWARFDebugNames::Entry>::operator->
                             ((Expected<llvm::DWARFDebugNames::Entry> *)local_198);
          OVar12 = DWARFDebugNames::Entry::getDIEUnitOffset(ptVar8);
          DIE.Die = (DWARFDebugInfoEntry *)OVar12.Storage.field_0;
          puVar9 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&DIE.Die);
          local_238 = uVar10 + *puVar9;
          DVar13 = DWARFContext::getDIEForOffset(this->DCtx,local_238);
          DIE.U = (DWARFUnit *)DVar13.Die;
          local_258 = (undefined1  [8])DVar13.U;
          bVar2 = DWARFDie::operator_cast_to_bool((DWARFDie *)local_258);
          if (bVar2) {
            pDVar11 = DWARFDie::getDwarfUnit((DWARFDie *)local_258);
            uVar10 = DWARFUnit::getOffset(pDVar11);
            if (uVar10 != DIEOffset) {
              prVar7 = error(this);
              local_368 = DWARFDebugNames::NameIndex::getUnitOffset((NameIndex *)NTE_local);
              pDVar11 = DWARFDie::getDwarfUnit((DWARFDie *)local_258);
              local_370 = DWARFUnit::getOffset(pDVar11);
              formatv<unsigned_long,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long>
                        (&local_360,
                         "Name Index @ {0:x}: Entry @ {1:x}: mismatched CU of DIE @ {2:x}: index - {3:x}; debug_info - {4:x}.\n"
                         ,&local_368,&NextEntryID,&local_238,&DIEOffset,&local_370);
              raw_ostream::operator<<(prVar7,&local_360.super_formatv_object_base);
              formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>_>
              ::~formatv_object(&local_360);
              EntryID._4_4_ = EntryID._4_4_ + 1;
            }
            TVar3 = DWARFDie::getTag((DWARFDie *)local_258);
            ptVar8 = Expected<llvm::DWARFDebugNames::Entry>::operator->
                               ((Expected<llvm::DWARFDebugNames::Entry> *)local_198);
            TVar4 = DWARFDebugNames::Entry::tag(ptVar8);
            if (TVar3 != TVar4) {
              prVar7 = error(this);
              local_408 = DWARFDebugNames::NameIndex::getUnitOffset((NameIndex *)NTE_local);
              ptVar8 = Expected<llvm::DWARFDebugNames::Entry>::operator->
                                 ((Expected<llvm::DWARFDebugNames::Entry> *)local_198);
              EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._14_2_ =
                   DWARFDebugNames::Entry::tag(ptVar8);
              EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._12_2_ =
                   DWARFDie::getTag((DWARFDie *)local_258);
              formatv<unsigned_long,_unsigned_long_&,_unsigned_long_&,_llvm::dwarf::Tag,_llvm::dwarf::Tag>
                        (&local_400,
                         "Name Index @ {0:x}: Entry @ {1:x}: mismatched Tag of DIE @ {2:x}: index - {3}; debug_info - {4}.\n"
                         ,&local_408,&NextEntryID,&local_238,
                         (Tag *)(EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts
                                 [1].buffer + 0xe),
                         (Tag *)(EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts
                                 [1].buffer + 0xc));
              raw_ostream::operator<<(prVar7,&local_400.super_formatv_object_base);
              formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_>_>
              ::~formatv_object(&local_400);
              EntryID._4_4_ = EntryID._4_4_ + 1;
            }
            getNames((SmallVector<llvm::StringRef,_2U> *)local_440,(DWARFDie *)local_258,true);
            bVar2 = is_contained<llvm::SmallVector<llvm::StringRef,2u>&,llvm::StringRef>
                              ((SmallVector<llvm::StringRef,_2U> *)local_440,
                               (StringRef *)&NumEntries);
            if (!bVar2) {
              prVar7 = error(this);
              local_4e0 = DWARFDebugNames::NameIndex::getUnitOffset((NameIndex *)NTE_local);
              x = SmallVectorTemplateCommon<llvm::StringRef,_void>::begin
                            ((SmallVectorTemplateCommon<llvm::StringRef,_void> *)local_440);
              y = SmallVectorTemplateCommon<llvm::StringRef,_void>::end
                            ((SmallVectorTemplateCommon<llvm::StringRef,_void> *)local_440);
              iVar14 = make_range<llvm::StringRef*>(x,y);
              local_4f0 = iVar14;
              formatv<unsigned_long,_unsigned_long_&,_unsigned_long_&,_llvm::StringRef_&,_llvm::iterator_range<llvm::StringRef_*>_>
                        (&local_4d8,
                         "Name Index @ {0:x}: Entry @ {1:x}: mismatched Name of DIE @ {2:x}: index - {3}; debug_info - {4}.\n"
                         ,&local_4e0,&NextEntryID,&local_238,(StringRef *)&NumEntries,&local_4f0);
              raw_ostream::operator<<(prVar7,&local_4d8.super_formatv_object_base);
              formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>_>
              ::~formatv_object(&local_4d8);
              EntryID._4_4_ = EntryID._4_4_ + 1;
            }
            SmallVector<llvm::StringRef,_2U>::~SmallVector
                      ((SmallVector<llvm::StringRef,_2U> *)local_440);
          }
          else {
            prVar7 = error(this);
            local_2d0 = DWARFDebugNames::NameIndex::getUnitOffset((NameIndex *)NTE_local);
            formatv<unsigned_long,_unsigned_long_&,_unsigned_long_&>
                      (&local_2c8,
                       "Name Index @ {0:x}: Entry @ {1:x} references a non-existing DIE @ {2:x}.\n",
                       &local_2d0,&NextEntryID,&local_238);
            raw_ostream::operator<<(prVar7,&local_2c8.super_formatv_object_base);
            formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
            ::~formatv_object(&local_2c8);
            EntryID._4_4_ = EntryID._4_4_ + 1;
          }
        }
        EntryID._0_4_ = (int)EntryID + 1;
        NextEntryID = EntryOr._184_8_;
        DWARFDebugNames::NameIndex::getEntry
                  ((Expected<llvm::DWARFDebugNames::Entry> *)(local_5b8 + 8),(NameIndex *)NTE_local,
                   (uint64_t *)&EntryOr.field_0xb8);
        Expected<llvm::DWARFDebugNames::Entry>::operator=
                  ((Expected<llvm::DWARFDebugNames::Entry> *)local_198,
                   (Expected<llvm::DWARFDebugNames::Entry> *)(local_5b8 + 8));
        Expected<llvm::DWARFDebugNames::Entry>::~Expected
                  ((Expected<llvm::DWARFDebugNames::Entry> *)(local_5b8 + 8));
      }
      Expected<llvm::DWARFDebugNames::Entry>::takeError
                ((Expected<llvm::DWARFDebugNames::Entry> *)local_5b8);
      local_5e8.NumEntries = (uint *)&EntryID;
      local_5e8.NI = (NameIndex *)NTE_local;
      local_5e8.NTE = (NameTableEntry *)CStr;
      local_610.Str = (StringRef *)&NumEntries;
      local_610.NumErrors = (uint *)((long)&EntryID + 4);
      local_610.NI = (NameIndex *)NTE_local;
      local_610.NTE = (NameTableEntry *)CStr;
      local_610.this = this;
      local_5e8.this = this;
      local_5e8.Str = local_610.Str;
      local_5e8.NumErrors = local_610.NumErrors;
      handleAllErrors<llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__0,llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__1>
                ((Error *)local_5b8,&local_5e8,&local_610);
      Error::~Error((Error *)local_5b8);
      this_local._4_4_ = EntryID._4_4_;
      Expected<llvm::DWARFDebugNames::Entry>::~Expected
                ((Expected<llvm::DWARFDebugNames::Entry> *)local_198);
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned DWARFVerifier::verifyNameIndexEntries(
    const DWARFDebugNames::NameIndex &NI,
    const DWARFDebugNames::NameTableEntry &NTE) {
  // Verifying type unit indexes not supported.
  if (NI.getLocalTUCount() + NI.getForeignTUCount() > 0)
    return 0;

  const char *CStr = NTE.getString();
  if (!CStr) {
    error() << formatv(
        "Name Index @ {0:x}: Unable to get string associated with name {1}.\n",
        NI.getUnitOffset(), NTE.getIndex());
    return 1;
  }
  StringRef Str(CStr);

  unsigned NumErrors = 0;
  unsigned NumEntries = 0;
  uint64_t EntryID = NTE.getEntryOffset();
  uint64_t NextEntryID = EntryID;
  Expected<DWARFDebugNames::Entry> EntryOr = NI.getEntry(&NextEntryID);
  for (; EntryOr; ++NumEntries, EntryID = NextEntryID,
                                EntryOr = NI.getEntry(&NextEntryID)) {
    uint32_t CUIndex = *EntryOr->getCUIndex();
    if (CUIndex > NI.getCUCount()) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x} contains an "
                         "invalid CU index ({2}).\n",
                         NI.getUnitOffset(), EntryID, CUIndex);
      ++NumErrors;
      continue;
    }
    uint64_t CUOffset = NI.getCUOffset(CUIndex);
    uint64_t DIEOffset = CUOffset + *EntryOr->getDIEUnitOffset();
    DWARFDie DIE = DCtx.getDIEForOffset(DIEOffset);
    if (!DIE) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x} references a "
                         "non-existing DIE @ {2:x}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset);
      ++NumErrors;
      continue;
    }
    if (DIE.getDwarfUnit()->getOffset() != CUOffset) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x}: mismatched CU of "
                         "DIE @ {2:x}: index - {3:x}; debug_info - {4:x}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset, CUOffset,
                         DIE.getDwarfUnit()->getOffset());
      ++NumErrors;
    }
    if (DIE.getTag() != EntryOr->tag()) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x}: mismatched Tag of "
                         "DIE @ {2:x}: index - {3}; debug_info - {4}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset, EntryOr->tag(),
                         DIE.getTag());
      ++NumErrors;
    }

    auto EntryNames = getNames(DIE);
    if (!is_contained(EntryNames, Str)) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x}: mismatched Name "
                         "of DIE @ {2:x}: index - {3}; debug_info - {4}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset, Str,
                         make_range(EntryNames.begin(), EntryNames.end()));
      ++NumErrors;
    }
  }
  handleAllErrors(EntryOr.takeError(),
                  [&](const DWARFDebugNames::SentinelError &) {
                    if (NumEntries > 0)
                      return;
                    error() << formatv("Name Index @ {0:x}: Name {1} ({2}) is "
                                       "not associated with any entries.\n",
                                       NI.getUnitOffset(), NTE.getIndex(), Str);
                    ++NumErrors;
                  },
                  [&](const ErrorInfoBase &Info) {
                    error()
                        << formatv("Name Index @ {0:x}: Name {1} ({2}): {3}\n",
                                   NI.getUnitOffset(), NTE.getIndex(), Str,
                                   Info.message());
                    ++NumErrors;
                  });
  return NumErrors;
}